

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O2

void __thiscall adjMaxtrix<char>::~adjMaxtrix(adjMaxtrix<char> *this)

{
  int i;
  ulong uVar1;
  
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start); uVar1 = uVar1 + 1) {
    if (this->edge[uVar1] != (int *)0x0) {
      operator_delete__(this->edge[uVar1]);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)this);
  return;
}

Assistant:

adjMaxtrix<dataType>::~adjMaxtrix()
{
	//撤销矩阵
	for (int i = 0; i < vexs.size(); i++)
		delete[] edge[i];
}